

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter3.cpp
# Opt level: O2

void chapter3::initialize_exclude_set
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *exclude_set)

{
  int iVar1;
  allocator local_1e;
  allocator local_1d;
  allocator local_1c;
  allocator local_1b;
  allocator local_1a;
  allocator local_19;
  
  if (initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
      ::exclude_words_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                                 ::exclude_words_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string
                ((string *)
                 initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                 ::exclude_words_abi_cxx11_,"a",&local_19);
      std::__cxx11::string::string
                ((string *)
                 (initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                  ::exclude_words_abi_cxx11_ + 1),"an",&local_1a);
      std::__cxx11::string::string
                ((string *)
                 (initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                  ::exclude_words_abi_cxx11_ + 2),"or",&local_1b);
      std::__cxx11::string::string
                ((string *)
                 (initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                  ::exclude_words_abi_cxx11_ + 3),"the",&local_1c);
      std::__cxx11::string::string
                ((string *)
                 (initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                  ::exclude_words_abi_cxx11_ + 4),"and",&local_1d);
      std::__cxx11::string::string
                ((string *)
                 (initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                  ::exclude_words_abi_cxx11_ + 5),"but",&local_1e);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                           ::exclude_words_abi_cxx11_);
    }
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_range_unique<std::__cxx11::string*>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)exclude_set,
             initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
             ::exclude_words_abi_cxx11_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
              ::exclude_words_abi_cxx11_);
  return;
}

Assistant:

inline void chapter3::initialize_exclude_set(set<string> &exclude_set) {
    static string exclude_words[] = {
            "a", "an", "or", "the", "and", "but"
    };
    exclude_set.insert(exclude_words, exclude_words + sizeof(exclude_words) / sizeof(*exclude_words));
    // set<string> exclude_set(filter_str_array, filter_str_array + sizeof(filter_str_array) / sizeof(*filter_str_array));
    /*cout << sizeof(filter_str_array) << endl;
    cout << filter_str_array << endl;
    cout << sizeof(*filter_str_array) << endl;
    cout << *filter_str_array << endl;
    cout << sizeof(filter_str_array) / sizeof(*filter_str_array) << endl;
    cout << filter_sets.size() << endl;*/
}